

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)14>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  long lVar1;
  QRgbaFloat32 *pQVar2;
  int in_ECX;
  int in_EDX;
  uchar *in_RSI;
  QRgbaFloat32 *in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar3;
  int i;
  undefined8 in_stack_ffffffffffffff98;
  int local_5c;
  undefined8 local_28;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_5c = 0; local_5c < in_ECX; local_5c = local_5c + 1) {
    fetchPixel<(QPixelLayout::BPP)4>(in_RSI,in_EDX + local_5c);
    convertPixelToRGB32<(QImage::Format)14>((uint)((ulong)in_RSI >> 0x20));
    QVar3 = QRgbaFloat<float>::fromArgb32((uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_28 = QVar3._0_8_;
    local_20 = QVar3._8_8_;
    pQVar2 = in_RDI + local_5c;
    pQVar2->r = (float)(undefined4)local_28;
    pQVar2->g = (float)local_28._4_4_;
    pQVar2->b = (float)(undefined4)local_20;
    pQVar2->a = (float)local_20._4_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}